

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O2

void __thiscall
wasm::BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter>::visitTryTable
          (BinaryenIRWriter<wasm::BinaryenIRToBinaryWriter> *this,TryTable *curr)

{
  BinaryInstWriter *this_00;
  
  this_00 = (BinaryInstWriter *)(this + 2);
  BinaryInstWriter::visit(this_00,(Expression *)curr);
  visitPossibleBlockContents(this,curr->body);
  BinaryInstWriter::emitScopeEnd(this_00,(Expression *)curr);
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id == 1) {
    BinaryInstWriter::emitUnreachable(this_00);
    return;
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitTryTable(TryTable* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->body);
  emitScopeEnd(curr);
  if (curr->type == Type::unreachable) {
    emitUnreachable();
  }
}